

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::AddAction::operator()
          (AddAction *this,iterator_t *str,iterator_t *end)

{
  Index AI;
  DecPOMDPDiscrete *pDVar1;
  string s;
  string local_128;
  string local_108;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_e8;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_80;
  
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_80,str);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_e8,end);
  std::__cxx11::string::
  string<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,void>
            ((string *)&local_108,&local_80,&local_e8,(allocator<char> *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p !=
      &local_e8._pos.
       super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .file.field_2) {
    operator_delete(local_e8._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_e8._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_e8._end.super_type.m_iterator.m_mem.pn);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_e8.super_type.m_iterator.super_type.m_iterator.m_mem + 8)
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p !=
      &local_80._pos.
       super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .file.field_2) {
    operator_delete(local_80._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_80._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_80._end.super_type.m_iterator.m_mem.pn);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_80.super_type.m_iterator.super_type.m_iterator.m_mem + 8)
            );
  pDVar1 = this->_m_po->_m_decPOMDPDiscrete;
  AI = this->_m_po->_m_curAI;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
  MADPComponentDiscreteActions::AddAction
            (&(pDVar1->super_MultiAgentDecisionProcessDiscrete)._m_A,AI,&local_108,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                std::string s(str, end);
                _m_po->GetDecPOMDPDiscrete()->AddAction(_m_po->_m_curAI, s);
                if(DEBUG_PARSE)
                    std::cout << "AddAction: added action "<<s <<
                        " for agent "<<_m_po->_m_curAI<<std::endl;
            }